

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O3

int TestInit4DOM(char *xmlFile,bool gDoNamespaces,bool gDoSchema,bool gSchemaFullChecking,
                Teststate theState)

{
  XercesDOMParser *this;
  ulong uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  InitTermTestErrorHandler errorHandler;
  
  lVar3 = 1;
  lVar4 = lVar3;
  if (theState - Multiple < 4) {
    lVar3 = *(long *)(&DAT_00104468 + (ulong)(theState - Multiple) * 8);
    lVar4 = lVar3;
  }
  do {
    uVar1 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  if (theState == ExceedLimit) {
    uVar1 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
  }
  this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,uVar1);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  bVar2 = SUB81(this,0);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar2);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar2);
  xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(bVar2);
  xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(bVar2);
  xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this);
  xercesc_4_0::AbstractDOMParser::parse((char *)this);
  (**(code **)(*(long *)this + 8))(this);
  do {
    xercesc_4_0::XMLPlatformUtils::Terminate();
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  if ((theState == ExceedLimit) || (theState == UnEven)) {
    xercesc_4_0::XMLPlatformUtils::Terminate();
  }
  return 0;
}

Assistant:

int TestInit4DOM(const char* xmlFile, bool gDoNamespaces, bool gDoSchema, bool gSchemaFullChecking, Teststate theState)
{
    TESTINITPRE;
    XercesDOMParser* parser = new XercesDOMParser;
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    TESTINITPOST;
}